

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context *pCVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FieldDescriptor *pFVar6;
  OneofDescriptor *pOVar7;
  ImmutableFieldLiteGenerator *pIVar8;
  OneofGeneratorInfo *pOVar9;
  string *s;
  ulong uVar10;
  ulong extraout_RDX;
  string local_d8;
  uint local_b8;
  int local_b4;
  int i_4;
  int totalInts;
  int i_3;
  int totalBits;
  OneofDescriptor *field_1;
  undefined1 local_98 [4];
  int i_2;
  string local_78;
  FieldDescriptor *local_58;
  FieldDescriptor *field;
  int j;
  int i_1;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "Visitor visitor = (Visitor) arg0;\n$classname$ other = ($classname$) arg1;\n",
                     "classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  for (j = 0; iVar5 = j, iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_)
      , iVar5 < iVar4; j = j + 1) {
    pFVar6 = Descriptor::field((this->super_MessageGenerator).descriptor_,j);
    pOVar7 = FieldDescriptor::containing_oneof(pFVar6);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      pFVar6 = Descriptor::field((this->super_MessageGenerator).descriptor_,j);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,pFVar6);
      (*pIVar8->_vptr_ImmutableFieldLiteGenerator[8])(pIVar8,local_18);
    }
  }
  for (field._4_4_ = 0; iVar5 = field._4_4_,
      iVar4 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      pPVar2 = local_18, iVar5 < iVar4; field._4_4_ = field._4_4_ + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field._4_4_);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                       "oneof_capitalized_name",&pOVar9->capitalized_name);
    io::Printer::Indent(local_18);
    field._0_4_ = 0;
    while( true ) {
      iVar5 = (int)field;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field._4_4_);
      iVar4 = OneofDescriptor::field_count(pOVar7);
      pPVar2 = local_18;
      if (iVar4 <= iVar5) break;
      pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field._4_4_);
      local_58 = OneofDescriptor::field(pOVar7,(int)field);
      pPVar2 = local_18;
      s = FieldDescriptor::name_abi_cxx11_(local_58);
      ToUpper(&local_78,s);
      io::Printer::Print(pPVar2,"case $field_name$: {\n","field_name",&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      io::Printer::Indent(local_18);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,local_58);
      (*pIVar8->_vptr_ImmutableFieldLiteGenerator[8])(pIVar8,local_18);
      io::Printer::Print(local_18,"break;\n");
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
      field._0_4_ = (int)field + 1;
    }
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field._4_4_);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    ToUpper((string *)local_98,&pOVar9->name);
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field._4_4_);
    pOVar9 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    io::Printer::Print(pPVar2,
                       "case $cap_oneof_name$_NOT_SET: {\n  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n  break;\n}\n"
                       ,"cap_oneof_name",(string *)local_98,"oneof_name",&pOVar9->name);
    std::__cxx11::string::~string((string *)local_98);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  io::Printer::Print(local_18,
                     "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n    .INSTANCE) {\n"
                    );
  io::Printer::Indent(local_18);
  for (field_1._4_4_ = 0; iVar5 = field_1._4_4_,
      iVar4 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      iVar5 < iVar4; field_1._4_4_ = field_1._4_4_ + 1) {
    _i_3 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,field_1._4_4_);
    pPVar2 = local_18;
    pOVar9 = Context::GetOneofGeneratorInfo(this->context_,_i_3);
    io::Printer::Print(pPVar2,
                       "if (other.$oneof_name$Case_ != 0) {\n  $oneof_name$Case_ = other.$oneof_name$Case_;\n}\n"
                       ,"oneof_name",&pOVar9->name);
  }
  bVar3 = anon_unknown_12::GenerateHasBits((this->super_MessageGenerator).descriptor_);
  if (bVar3) {
    totalInts = 0;
    for (i_4 = 0; iVar5 = i_4,
        iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar5 < iVar4;
        i_4 = i_4 + 1) {
      pFVar6 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_4);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,pFVar6);
      iVar5 = (*pIVar8->_vptr_ImmutableFieldLiteGenerator[2])();
      totalInts = iVar5 + totalInts;
    }
    local_b4 = (totalInts + 0x1f) / 0x20;
    uVar10 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
    for (local_b8 = 0; pPVar2 = local_18, (int)local_b8 < local_b4; local_b8 = local_b8 + 1) {
      GetBitFieldName_abi_cxx11_(&local_d8,(java *)(ulong)local_b8,(int)uVar10);
      io::Printer::Print(pPVar2,"$bit_field_name$ |= other.$bit_field_name$;\n","bit_field_name",
                         &local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      uVar10 = extraout_RDX;
    }
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  io::Printer::Print(local_18,"return this;\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit(
    io::Printer* printer) {
  printer->Print(
    "Visitor visitor = (Visitor) arg0;\n"
    "$classname$ other = ($classname$) arg1;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(
          descriptor_->field(i)).GenerateVisitCode(printer);
    }
  }

  // Merge oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
      "switch (other.get$oneof_capitalized_name$Case()) {\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_name$: {\n",
        "field_name",
        ToUpper(field->name()));
      printer->Indent();
      field_generators_.get(field).GenerateVisitCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
      "case $cap_oneof_name$_NOT_SET: {\n"
      "  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n"
      "  break;\n"
      "}\n",
      "cap_oneof_name",
      ToUpper(context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name),
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n"
    "    .INSTANCE) {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    const OneofDescriptor* field = descriptor_->oneof_decl(i);
    printer->Print(
      "if (other.$oneof_name$Case_ != 0) {\n"
      "  $oneof_name$Case_ = other.$oneof_name$Case_;\n"
      "}\n",
      "oneof_name", context_->GetOneofGeneratorInfo(field)->name);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;

    for (int i = 0; i < totalInts; i++) {
      printer->Print(
        "$bit_field_name$ |= other.$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }
  printer->Outdent();
  printer->Print(
    "}\n");


  printer->Print(
    "return this;\n");
}